

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QHttpNetworkRequestPrivate>::~QSharedDataPointer
          (QSharedDataPointer<QHttpNetworkRequestPrivate> *this)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = (this->d).ptr;
  if (pQVar1 != (QHttpNetworkRequestPrivate *)0x0) {
    LOCK();
    (pQVar1->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(pQVar1->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + -1);
    UNLOCK();
    if (((__atomic_base<int>)
         *(__int_type *)
          &(pQVar1->super_QHttpNetworkHeaderPrivate).super_QSharedData.ref.super_QAtomicInteger<int>
           .super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x0) &&
       (pQVar1 = (this->d).ptr, pQVar1 != (QHttpNetworkRequestPrivate *)0x0)) {
      QHttpNetworkRequestPrivate::~QHttpNetworkRequestPrivate(pQVar1);
      operator_delete(pQVar1,0xd0);
      return;
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }